

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O0

bool MeCab::Viterbi::initNBest(Lattice *lattice)

{
  ulong uVar1;
  long *in_RDI;
  NBestGenerator *unaff_retaddr;
  Allocator<mecab_node_t,_mecab_path_t> *in_stack_00000010;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar1 = (**(code **)(*in_RDI + 0x90))(in_RDI,2);
  if ((uVar1 & 1) != 0) {
    (**(code **)(*in_RDI + 0xb0))();
    Allocator<mecab_node_t,_mecab_path_t>::nbest_generator(in_stack_00000010);
    NBestGenerator::set(unaff_retaddr,
                        (Lattice *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  }
  return true;
}

Assistant:

bool Viterbi::initNBest(Lattice *lattice) {
  if (!lattice->has_request_type(MECAB_NBEST)) {
    return true;
  }
  lattice->allocator()->nbest_generator()->set(lattice);
  return true;
}